

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAabbUtil2.h
# Opt level: O2

void btTransformAabb(btVector3 *localAabbMin,btVector3 *localAabbMax,btScalar margin,
                    btTransform *trans,btVector3 *aabbMinOut,btVector3 *aabbMaxOut)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  btVector3 bVar3;
  btVector3 bVar4;
  btVector3 localCenter;
  btMatrix3x3 abs_b;
  float local_a8;
  float local_98;
  float fStack_94;
  btVector3 local_80;
  btVector3 local_70;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  
  bVar3 = operator-(localAabbMax,localAabbMin);
  local_70.m_floats[1] = margin + bVar3.m_floats[1] * 0.5;
  local_70.m_floats[0] = margin + bVar3.m_floats[0] * 0.5;
  local_70.m_floats[2] = bVar3.m_floats[2] * 0.5 + margin;
  local_70.m_floats[3] = 0.0;
  bVar3 = operator+(localAabbMax,localAabbMin);
  local_80.m_floats[1] = bVar3.m_floats[1] * 0.5;
  local_80.m_floats[0] = bVar3.m_floats[0] * 0.5;
  local_80.m_floats[2] = bVar3.m_floats[2] * 0.5;
  local_80.m_floats[3] = 0.0;
  btMatrix3x3::absolute(&trans->m_basis);
  bVar3 = btTransform::operator()(trans,&local_80);
  bVar4 = btVector3::dot3(&local_70,&local_60,&local_50,&local_40);
  local_98 = bVar3.m_floats[0];
  fStack_94 = bVar3.m_floats[1];
  local_a8 = bVar3.m_floats[2];
  auVar1._4_4_ = fStack_94 - bVar4.m_floats[1];
  auVar1._0_4_ = local_98 - bVar4.m_floats[0];
  auVar1._8_4_ = local_a8 - bVar4.m_floats[2];
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])aabbMinOut->m_floats = auVar1;
  auVar2._4_4_ = fStack_94 + bVar4.m_floats[1];
  auVar2._0_4_ = local_98 + bVar4.m_floats[0];
  auVar2._8_4_ = local_a8 + bVar4.m_floats[2];
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])aabbMaxOut->m_floats = auVar2;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void btTransformAabb(const btVector3& localAabbMin,const btVector3& localAabbMax, btScalar margin,const btTransform& trans,btVector3& aabbMinOut,btVector3& aabbMaxOut)
{
		btAssert(localAabbMin.getX() <= localAabbMax.getX());
		btAssert(localAabbMin.getY() <= localAabbMax.getY());
		btAssert(localAabbMin.getZ() <= localAabbMax.getZ());
		btVector3 localHalfExtents = btScalar(0.5)*(localAabbMax-localAabbMin);
		localHalfExtents+=btVector3(margin,margin,margin);

		btVector3 localCenter = btScalar(0.5)*(localAabbMax+localAabbMin);
		btMatrix3x3 abs_b = trans.getBasis().absolute();  
		btVector3 center = trans(localCenter);
        btVector3 extent = localHalfExtents.dot3( abs_b[0], abs_b[1], abs_b[2] );
		aabbMinOut = center-extent;
		aabbMaxOut = center+extent;
}